

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O0

_Bool Curl_uint_spbset_first(uint_spbset *bset,uint *pfirst)

{
  ulong uVar1;
  int iVar2;
  uint local_2c;
  uint_spbset_chunk *puStack_28;
  uint i;
  uint_spbset_chunk *chunk;
  uint *pfirst_local;
  uint_spbset *bset_local;
  
  puStack_28 = &bset->head;
  do {
    if (puStack_28 == (uint_spbset_chunk *)0x0) {
      *pfirst = 0;
      return false;
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      if (puStack_28->slots[local_2c] != 0) {
        iVar2 = 0;
        for (uVar1 = puStack_28->slots[local_2c]; (uVar1 & 1) == 0;
            uVar1 = uVar1 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        *pfirst = puStack_28->offset + local_2c * 0x40 + iVar2;
        return true;
      }
    }
    puStack_28 = ((uint_spbset_chunk *)&puStack_28->next)->next;
  } while( true );
}

Assistant:

bool Curl_uint_spbset_first(struct uint_spbset *bset, unsigned int *pfirst)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i]) {
        *pfirst = chunk->offset + ((i * 64) + CURL_CTZ64(chunk->slots[i]));
        return TRUE;
      }
    }
  }
  *pfirst = 0; /* give it a defined value even if it should not be used */
  return FALSE;
}